

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImgProcessor.cpp
# Opt level: O2

ImgProcessor * __thiscall
pobr::imgProcessing::ImgProcessor::processPreEnhance(ImgProcessor *this,Mat *img,bool *isProfiling)

{
  char *in_RCX;
  double dVar1;
  PerformanceTimer profiler;
  allocator local_ca;
  allocator local_c9;
  PerformanceTimer local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  cv::Mat::Mat(&this->img,(Mat *)isProfiling);
  local_c8.pointStart.__d.__r = (duration)0;
  local_c8.pointStop.__d.__r = (duration)0;
  pobr::utils::PerformanceTimer::start(&local_c8);
  pobr::utils::PerformanceTimer::stop(&local_c8);
  if (*in_RCX == '\x01') {
    std::__cxx11::string::string((string *)&local_70,"PreEnhance phase took: ",&local_c9);
    dVar1 = pobr::utils::PerformanceTimer::getDurationNS(&local_c8);
    std::__cxx11::to_string(&local_90,dVar1 / 1000000.0);
    std::operator+(&local_50,&local_70,&local_90);
    std::__cxx11::string::string((string *)&local_b0,"ms",&local_ca);
    std::operator+(&local_30,&local_50,&local_b0);
    pobr::utils::Logger::notice(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return this;
}

Assistant:

cv::Mat
ImgProcessor::processPreEnhance(const cv::Mat& img, const bool& isProfiling)
const
{
    auto resultImg = img;

    PerformanceTimer profiler;

    profiler.start();

    // Note: disabled, as not needed
    //       supplied images are rather sharp

    // resultImg = enhance::unsharpMasking(resultImg);

    profiler.stop();

    if (isProfiling) {
        Logger::notice(
            std::string("PreEnhance phase took: ") +
            std::to_string(profiler.getDurationNS() / 1000000) +
            std::string("ms")
        );
    }

    return resultImg;
}